

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O0

void __thiscall Randomizer::Randomizer(Randomizer *this)

{
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  uniform_real_distribution<float> *puVar1;
  uniform_int_distribution<int> *this_01;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  result_type local_18;
  rep seed;
  Randomizer *this_local;
  
  seed = (rep)this;
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_28);
  local_18 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  this_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             *)operator_new(5000);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this_00,local_18);
  this->RndCore = this_00;
  puVar1 = (uniform_real_distribution<float> *)operator_new(8);
  std::uniform_real_distribution<float>::uniform_real_distribution(puVar1,0.0,60.0);
  this->XAxisRnd = puVar1;
  puVar1 = (uniform_real_distribution<float> *)operator_new(8);
  std::uniform_real_distribution<float>::uniform_real_distribution(puVar1,0.0,90.0);
  this->YAxisRnd = puVar1;
  puVar1 = (uniform_real_distribution<float> *)operator_new(8);
  std::uniform_real_distribution<float>::uniform_real_distribution(puVar1,0.0,362880.0);
  this->RespawnRnd = puVar1;
  this_01 = (uniform_int_distribution<int> *)operator_new(8);
  std::uniform_int_distribution<int>::uniform_int_distribution(this_01,10,0x14);
  this->WanderRnd = this_01;
  return;
}

Assistant:

Randomizer::Randomizer()
{
    auto seed = chrono::system_clock::now().time_since_epoch().count();
    RndCore = new mt19937(seed);
    XAxisRnd = new uniform_real_distribution<float>(0, MapWidth);
    YAxisRnd = new uniform_real_distribution<float>(0, MapHeight);
    RespawnRnd = new uniform_real_distribution<float>(0, RespawnRndMax);
    WanderRnd = new uniform_int_distribution<int>(WanderIntervalLB, WanderIntervalUB);
}